

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::GBufferFilm,pbrt::FilmBaseParameters&,pbrt::RGBColorSpace_const*&,float&,bool&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,GBufferFilm *p,FilmBaseParameters *args,
          RGBColorSpace **args_1,float *args_2,bool *args_3,polymorphic_allocator<std::byte> *args_4
          )

{
  FilmBaseParameters *in_RSI;
  bool in_stack_00000013;
  Float in_stack_00000014;
  RGBColorSpace *in_stack_00000018;
  FilmBaseParameters *in_stack_00000020;
  GBufferFilm *in_stack_00000028;
  Allocator in_stack_00000030;
  FilmBaseParameters local_80;
  
  pbrt::FilmBaseParameters::FilmBaseParameters(&local_80,in_RSI);
  pbrt::GBufferFilm::GBufferFilm
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014,
             in_stack_00000013,in_stack_00000030);
  pbrt::FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x6c24a0);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }